

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_fcaddd_arm(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  ulong uVar1;
  ulong opr_sz_00;
  uint64_t uVar2;
  float64 fVar3;
  float64 fVar4;
  uintptr_t max_sz;
  float64 e3;
  float64 e2;
  float64 e1;
  float64 e0;
  uintptr_t i;
  uint64_t neg_imag;
  uint64_t neg_real;
  float_status *fpst;
  float64 *m;
  float64 *n;
  float64 *d;
  uintptr_t opr_sz;
  uint32_t desc_local;
  void *vfpst_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  uVar2 = extract64((ulong)desc,10,1);
  for (e0 = 0; e0 < opr_sz_00 >> 3; e0 = e0 + 2) {
    fVar4 = *(float64 *)((long)vn + e0 * 8 + 8);
    uVar1 = *(ulong *)((long)vm + e0 * 8);
    fVar3 = float64_add_arm(*(float64 *)((long)vn + e0 * 8),
                            *(ulong *)((long)vm + e0 * 8 + 8) ^ (uVar2 ^ 1) << 0x3f,
                            (float_status *)vfpst);
    *(float64 *)((long)vd + e0 * 8) = fVar3;
    fVar4 = float64_add_arm(fVar4,uVar1 ^ uVar2 << 0x3f,(float_status *)vfpst);
    *(float64 *)((long)vd + e0 * 8 + 8) = fVar4;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_fcaddd)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float64 *d = vd;
    float64 *n = vn;
    float64 *m = vm;
    float_status *fpst = vfpst;
    uint64_t neg_real = extract64(desc, SIMD_DATA_SHIFT, 1);
    uint64_t neg_imag = neg_real ^ 1;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 63;
    neg_imag <<= 63;

    for (i = 0; i < opr_sz / 8; i += 2) {
        float64 e0 = n[i];
        float64 e1 = m[i + 1] ^ neg_imag;
        float64 e2 = n[i + 1];
        float64 e3 = m[i] ^ neg_real;

        d[i] = float64_add(e0, e1, fpst);
        d[i + 1] = float64_add(e2, e3, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}